

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpatch.hpp
# Opt level: O0

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
jsoncons::jsonpatch::detail::
from_diff<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *source,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *target,
          string_view_type *path)

{
  ulong uVar1;
  type_conflict9 tVar2;
  bool bVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  iterator this;
  reference this_00;
  key_type *pkVar6;
  __normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  __t;
  key_type *result_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  undefined8 in_RDI;
  iterator iVar8;
  array_range_type aVar9;
  array_range_type aVar10;
  array_range_type aVar11;
  undefined1 auVar12 [16];
  const_object_iterator cVar13;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> bVar14;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> val_4;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> val_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ss_4;
  const_object_iterator it_1;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *a_2;
  iterator __end0_1;
  iterator __begin0_1;
  const_object_range_type *__range5_1;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> val_2;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> temp_diff_1;
  const_object_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ss_3;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *a_1;
  iterator __end0;
  iterator __begin0;
  const_object_range_type *__range5;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> val_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ss_2;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *a;
  size_t i_2;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ss_1;
  size_t i_1;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> temp_diff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ss;
  size_t i;
  size_t common;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *result;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
  *in_stack_fffffffffffff558;
  json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
  *in_stack_fffffffffffff560;
  allocator<char> *paVar15;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
  *in_stack_fffffffffffff568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff580;
  array *in_stack_fffffffffffff588;
  undefined7 in_stack_fffffffffffff590;
  undefined1 in_stack_fffffffffffff597;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffff5a8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffff5b0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffff5d0;
  iterator in_stack_fffffffffffff5d8;
  iterator in_stack_fffffffffffff5e0;
  iterator in_stack_fffffffffffff5e8;
  iterator in_stack_fffffffffffff5f0;
  string_view_type *in_stack_fffffffffffff5f8;
  reference in_stack_fffffffffffff600;
  undefined7 in_stack_fffffffffffff610;
  undefined1 in_stack_fffffffffffff617;
  iterator in_stack_fffffffffffff6c8;
  iterator in_stack_fffffffffffff6d0;
  string local_8b0 [32];
  undefined1 local_890 [16];
  string local_868 [32];
  undefined1 local_848 [16];
  string local_820 [32];
  string local_800 [32];
  undefined1 local_7e0 [16];
  allocator<char> local_7ca [2];
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> local_7c8 [2];
  string local_7a0 [32];
  undefined1 local_780 [16];
  string local_758 [32];
  undefined1 local_738 [16];
  string local_710 [32];
  string local_6f0 [32];
  undefined1 local_6d0 [16];
  allocator<char> local_6ba [2];
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> local_6b8;
  allocator<char> local_6a1;
  string local_6a0 [32];
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_680;
  undefined1 local_678;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  local_670;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_650;
  undefined1 local_648;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_640;
  undefined1 local_638;
  undefined1 local_630 [16];
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_620;
  undefined1 local_618;
  reference local_610;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_608;
  undefined1 local_600;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_5f8;
  undefined1 local_5f0;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_5e8;
  undefined1 local_5e0;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_5d8;
  undefined1 local_5d0;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  local_5c8;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  *local_5a8;
  string local_588 [32];
  undefined1 local_568 [16];
  string local_540 [32];
  string local_520 [32];
  undefined1 local_500 [16];
  allocator<char> local_4ea [2];
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> local_4e8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_4d8;
  range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  local_4d0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_4c0;
  array_range_type local_4b8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_4a8;
  array_range_type local_4a0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_490;
  undefined1 local_480 [16];
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_460;
  undefined1 local_458;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  local_450;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_430;
  undefined1 local_428;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_420;
  undefined1 local_418;
  undefined1 local_410 [16];
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_400;
  undefined1 local_3f8;
  allocator<char> local_3e9;
  string local_3e8 [32];
  reference local_3c8;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_3c0;
  undefined1 local_3b8;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_3b0;
  undefined1 local_3a8;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_3a0;
  undefined1 local_398;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_390;
  undefined1 local_388;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  local_380;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  *local_360;
  string local_340 [32];
  undefined1 local_320 [16];
  string local_2f8 [32];
  undefined1 local_2d8 [16];
  string local_2b0 [32];
  string local_290 [32];
  undefined1 local_270 [16];
  allocator<char> local_25a [2];
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> local_258;
  allocator<char> local_241;
  string local_240 [32];
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_220;
  ulong local_218;
  string local_1f8 [32];
  undefined1 local_1d8 [16];
  string local_1b0 [32];
  string local_190 [32];
  undefined1 local_170 [16];
  allocator<char> local_15a [2];
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> local_158;
  allocator<char> local_141;
  string local_140 [32];
  ulong local_120;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_118;
  range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  local_110;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_100;
  array_range_type local_f8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_e8;
  array_range_type local_e0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_d0;
  undefined1 local_c0 [16];
  allocator<char> local_99;
  string local_98 [32];
  ulong local_78;
  size_t local_70;
  size_t local_68;
  ulong local_60;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  
  uVar16 = 0;
  json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
  ::json_array(in_stack_fffffffffffff560);
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff597,in_stack_fffffffffffff590),in_stack_fffffffffffff588
             ,(semantic_tag)((ulong)in_stack_fffffffffffff580 >> 0x38));
  json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
  ::~json_array(in_stack_fffffffffffff560);
  tVar2 = jsoncons::operator==
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffff560,
                     (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffff558);
  uVar7 = extraout_RDX;
  if (!tVar2) {
    bVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )in_stack_fffffffffffff578);
    if ((bVar3) &&
       (bVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                          ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)in_stack_fffffffffffff578), bVar3)) {
      local_68 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                           ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)in_stack_fffffffffffff568);
      local_70 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                           ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)in_stack_fffffffffffff568);
      puVar4 = std::min<unsigned_long>(&local_68,&local_70);
      local_60 = *puVar4;
      for (local_78 = 0; local_78 < local_60; local_78 = local_78 + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,
                   (allocator<char> *)CONCAT17(in_stack_fffffffffffff597,in_stack_fffffffffffff590))
        ;
        std::allocator<char>::~allocator(&local_99);
        std::__cxx11::string::push_back((char)local_98);
        jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>
                  ((unsigned_long)in_stack_fffffffffffff6d0._M_current,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff6c8._M_current);
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::operator[]
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_fffffffffffff560,(size_t)in_stack_fffffffffffff558);
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::operator[]
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_fffffffffffff560,(size_t)in_stack_fffffffffffff558);
        auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view(local_98);
        local_c0 = auVar12;
        from_diff<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                  (in_RDX,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                           *)in_RCX,(string_view_type *)CONCAT17(uVar16,in_stack_ffffffffffffffd8));
        aVar10 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                 array_range(in_stack_fffffffffffff5b0);
        local_e0 = aVar10;
        local_d0 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
                   ::end(&local_e0);
        __gnu_cxx::
        __normal_iterator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const*,std::vector<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
        ::
        __normal_iterator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>*>
                  ((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff560,
                   (__normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff558);
        aVar10 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                 array_range(in_stack_fffffffffffff5b0);
        in_stack_fffffffffffff6d0 = aVar10.last_._M_current;
        local_f8 = aVar10;
        local_e8 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
                   ::begin(&local_f8);
        aVar10 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                 array_range(in_stack_fffffffffffff5b0);
        local_110.last_ = aVar10.last_._M_current;
        in_stack_fffffffffffff6c8 = aVar10.first_._M_current;
        local_110.first_._M_current = in_stack_fffffffffffff6c8._M_current;
        local_100 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                    range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
                    ::end(&local_110);
        local_118 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                    insert<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>*,std::vector<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
                              (in_stack_fffffffffffff5d0,in_stack_fffffffffffff5e8._M_current,
                               in_stack_fffffffffffff5e0._M_current,
                               in_stack_fffffffffffff5d8._M_current);
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   0x54e243);
        std::__cxx11::string::~string(local_98);
      }
      local_120 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                              *)in_stack_fffffffffffff568);
      while( true ) {
        uVar1 = local_120;
        local_120 = local_120 - 1;
        sVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                          ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)in_stack_fffffffffffff568);
        if (uVar1 <= sVar5) break;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,
                   (allocator<char> *)CONCAT17(in_stack_fffffffffffff597,in_stack_fffffffffffff590))
        ;
        std::allocator<char>::~allocator(&local_141);
        std::__cxx11::string::push_back((char)local_140);
        jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>
                  ((unsigned_long)in_stack_fffffffffffff6d0._M_current,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff6c8._M_current);
        std::allocator<char>::allocator();
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                  (&local_158,local_15a);
        std::allocator<char>::~allocator(local_15a);
        jsonpatch_names<char>::op_name_abi_cxx11_();
        auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view(local_190);
        local_170 = auVar12;
        jsonpatch_names<char>::remove_name_abi_cxx11_();
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<std::__cxx11::string>
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff5f0._M_current);
        std::__cxx11::string::~string(local_1b0);
        std::__cxx11::string::~string(local_190);
        jsonpatch_names<char>::path_name_abi_cxx11_();
        auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view(local_1f8);
        local_1d8 = auVar12;
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<std::__cxx11::string&>
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff5f0._M_current);
        std::__cxx11::string::~string(local_1f8);
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                  (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   0x54e518);
        std::__cxx11::string::~string(local_140);
      }
      local_218 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                              *)in_stack_fffffffffffff568);
      while( true ) {
        uVar1 = local_218;
        sVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                          ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)in_stack_fffffffffffff568);
        uVar7 = extraout_RDX_00;
        if (sVar5 <= uVar1) break;
        local_220 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                    operator[]((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                *)in_stack_fffffffffffff560,(size_t)in_stack_fffffffffffff558);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,
                   (allocator<char> *)CONCAT17(in_stack_fffffffffffff597,in_stack_fffffffffffff590))
        ;
        std::allocator<char>::~allocator(&local_241);
        std::__cxx11::string::push_back((char)local_240);
        jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>
                  ((unsigned_long)in_stack_fffffffffffff6d0._M_current,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff6c8._M_current);
        std::allocator<char>::allocator();
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                  (&local_258,local_25a);
        std::allocator<char>::~allocator(local_25a);
        jsonpatch_names<char>::op_name_abi_cxx11_();
        auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view(local_290);
        local_270 = auVar12;
        jsonpatch_names<char>::add_name_abi_cxx11_();
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<std::__cxx11::string>
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff5f0._M_current);
        std::__cxx11::string::~string(local_2b0);
        std::__cxx11::string::~string(local_290);
        jsonpatch_names<char>::path_name_abi_cxx11_();
        auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view(local_2f8);
        local_2d8 = auVar12;
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<std::__cxx11::string&>
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff5f0._M_current);
        std::__cxx11::string::~string(local_2f8);
        jsonpatch_names<char>::value_name_abi_cxx11_();
        auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view(local_340);
        local_320 = auVar12;
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&>
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                   in_stack_fffffffffffff5f0._M_current);
        std::__cxx11::string::~string(local_340);
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                  (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   0x54e8d6);
        std::__cxx11::string::~string(local_240);
        local_218 = local_218 + 1;
      }
    }
    else {
      bVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                        ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)in_stack_fffffffffffff578);
      if ((bVar3) &&
         (bVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                  is_object((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)in_stack_fffffffffffff578), bVar3)) {
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        object_range_abi_cxx11_
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610));
        local_360 = &local_380;
        iVar8 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
                ::begin(local_360);
        local_3a0 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                     *)iVar8.it_._M_current;
        local_398 = iVar8.has_value_;
        local_390 = local_3a0;
        local_388 = local_398;
        iVar8 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
                ::end(local_360);
        aVar9.last_._M_current = in_stack_fffffffffffff5e8._M_current;
        aVar9.first_._M_current = in_stack_fffffffffffff5f0._M_current;
        aVar10.last_._M_current = in_stack_fffffffffffff5d8._M_current;
        aVar10.first_._M_current = in_stack_fffffffffffff5e0._M_current;
        local_3c0 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                     *)iVar8.it_._M_current;
        local_3b8 = iVar8.has_value_;
        local_3b0 = local_3c0;
        local_3a8 = local_3b8;
        while( true ) {
          bVar3 = jsoncons::detail::
                  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                  ::operator!=((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                                *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
          if (!bVar3) break;
          local_3c8 = jsoncons::detail::
                      random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                      ::operator*((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                                   *)0x54eb1a);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffff597,in_stack_fffffffffffff590));
          std::allocator<char>::~allocator(&local_3e9);
          std::__cxx11::string::push_back((char)local_3e8);
          key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          ::key(local_3c8);
          jsonpointer::escape<std::__cxx11::string,std::__cxx11::string>
                    (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
          pkVar6 = key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   ::key(local_3c8);
          auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pkVar6);
          local_410 = auVar12;
          cVar13 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                   find_abi_cxx11_(aVar10.first_._M_current._M_current,
                                   (string_view_type *)aVar10.last_._M_current._M_current);
          local_420 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                       *)cVar13.it_._M_current;
          in_stack_fffffffffffff617 = cVar13.has_value_;
          local_418 = in_stack_fffffffffffff617;
          local_400 = local_420;
          local_3f8 = in_stack_fffffffffffff617;
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          object_range_abi_cxx11_
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610));
          iVar8 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
                  ::end(&local_450);
          local_460 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                       *)iVar8.it_._M_current;
          local_458 = iVar8.has_value_;
          local_430 = local_460;
          local_428 = local_458;
          bVar3 = jsoncons::detail::
                  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                  ::operator!=((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                                *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
          if (bVar3) {
            key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            ::value(local_3c8);
            in_stack_fffffffffffff600 =
                 jsoncons::detail::
                 random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                 ::operator*((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                              *)0x54ed00);
            in_stack_fffffffffffff5f8 =
                 (string_view_type *)
                 key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 ::value(in_stack_fffffffffffff600);
            auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view(local_3e8);
            local_480 = auVar12;
            from_diff<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                      (in_RDX,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                               *)in_RCX,
                       (string_view_type *)CONCAT17(uVar16,in_stack_ffffffffffffffd8));
            aVar9 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                    array_range(in_stack_fffffffffffff5b0);
            local_4a0 = aVar9;
            local_490 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                         *)range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
                           ::end(&local_4a0);
            __gnu_cxx::
            __normal_iterator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const*,std::vector<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
            ::
            __normal_iterator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>*>
                      ((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff560,
                       (__normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff558);
            aVar10 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                     array_range(in_stack_fffffffffffff5b0);
            local_4b8 = aVar10;
            local_4a8 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                         *)range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
                           ::begin(&local_4b8);
            aVar11 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                     array_range(in_stack_fffffffffffff5b0);
            local_4d0.last_ = aVar11.last_._M_current;
            this = aVar11.first_._M_current;
            local_4d0.first_._M_current = this._M_current;
            local_4c0 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                         *)range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
                           ::end(&local_4d0);
            local_4d8 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                         *)basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                           insert<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>*,std::vector<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
                                     (this._M_current,
                                      (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                       *)aVar9.last_._M_current,
                                      (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                       *)aVar10.first_._M_current,
                                      (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                       *)aVar10.last_._M_current);
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )0x54eeb6);
          }
          else {
            std::allocator<char>::allocator();
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                      (&local_4e8,local_4ea);
            std::allocator<char>::~allocator(local_4ea);
            jsonpatch_names<char>::op_name_abi_cxx11_();
            auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view(local_520);
            local_500 = auVar12;
            jsonpatch_names<char>::remove_name_abi_cxx11_();
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert_or_assign<std::__cxx11::string>
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       aVar9.first_._M_current._M_current);
            std::__cxx11::string::~string(local_540);
            std::__cxx11::string::~string(local_520);
            jsonpatch_names<char>::path_name_abi_cxx11_();
            auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view(local_588);
            local_568 = auVar12;
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert_or_assign<std::__cxx11::string&>
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       aVar9.first_._M_current._M_current);
            std::__cxx11::string::~string(local_588);
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                      (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )0x54f053);
          }
          std::__cxx11::string::~string(local_3e8);
          jsoncons::detail::
          random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
          ::operator++((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                        *)in_stack_fffffffffffff560);
        }
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        object_range_abi_cxx11_
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610));
        local_5a8 = &local_5c8;
        iVar8 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
                ::begin(local_5a8);
        local_5e8 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                     *)iVar8.it_._M_current;
        local_5e0 = iVar8.has_value_;
        local_5d8 = local_5e8;
        local_5d0 = local_5e0;
        iVar8 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
                ::end(local_5a8);
        local_608 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                     *)iVar8.it_._M_current;
        local_600 = iVar8.has_value_;
        local_5f8 = local_608;
        local_5f0 = local_600;
        while( true ) {
          bVar3 = jsoncons::detail::
                  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                  ::operator!=((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                                *)in_stack_fffffffffffff560,in_stack_fffffffffffff558);
          uVar7 = extraout_RDX_01;
          if (!bVar3) break;
          this_00 = jsoncons::detail::
                    random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                    ::operator*((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                                 *)0x54f203);
          this_01 = in_RSI;
          local_610 = this_00;
          pkVar6 = key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   ::key(this_00);
          auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pkVar6);
          local_630 = auVar12;
          cVar13 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                   find_abi_cxx11_(aVar10.first_._M_current._M_current,
                                   (string_view_type *)aVar10.last_._M_current._M_current);
          __t = cVar13.it_._M_current;
          uVar16 = cVar13.has_value_;
          local_640 = __t._M_current;
          local_638 = uVar16;
          local_620 = __t._M_current;
          local_618 = uVar16;
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          object_range_abi_cxx11_
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610));
          iVar8 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
                  ::end(&local_670);
          local_680 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                       *)iVar8.it_._M_current;
          local_678 = iVar8.has_value_;
          local_650 = local_680;
          local_648 = local_678;
          bVar3 = jsoncons::detail::
                  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                  ::operator==(in_stack_fffffffffffff568,
                               (random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                                *)in_stack_fffffffffffff560);
          if (bVar3) {
            pbVar17 = in_RCX;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      (this_01,(basic_string_view<char,_std::char_traits<char>_> *)__t._M_current,
                       (allocator<char> *)CONCAT17(uVar16,in_stack_fffffffffffff590));
            std::allocator<char>::~allocator(&local_6a1);
            std::__cxx11::string::push_back((char)local_6a0);
            result_00 = key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                        ::key(local_610);
            jsonpointer::escape<std::__cxx11::string,std::__cxx11::string>(in_RCX,result_00);
            std::allocator<char>::allocator();
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                      (&local_6b8,local_6ba);
            std::allocator<char>::~allocator(local_6ba);
            jsonpatch_names<char>::op_name_abi_cxx11_();
            auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view(local_6f0);
            local_6d0 = auVar12;
            jsonpatch_names<char>::add_name_abi_cxx11_();
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert_or_assign<std::__cxx11::string>
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       aVar9.first_._M_current._M_current);
            std::__cxx11::string::~string(local_710);
            std::__cxx11::string::~string(local_6f0);
            jsonpatch_names<char>::path_name_abi_cxx11_();
            auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view(local_758);
            local_738 = auVar12;
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert_or_assign<std::__cxx11::string&>
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       aVar9.first_._M_current._M_current);
            std::__cxx11::string::~string(local_758);
            jsonpatch_names<char>::value_name_abi_cxx11_();
            auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view(local_7a0);
            local_780 = auVar12;
            in_stack_fffffffffffff568 =
                 (random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                  *)key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    ::value(local_610);
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert_or_assign<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&>
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                       aVar9.first_._M_current._M_current);
            std::__cxx11::string::~string(local_7a0);
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )this_00,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                 *)pkVar6);
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )0x54f539);
            std::__cxx11::string::~string(local_6a0);
            in_RCX = pbVar17;
          }
          jsoncons::detail::
          random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
          ::operator++((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>
                        *)in_stack_fffffffffffff560);
        }
      }
      else {
        paVar15 = local_7ca;
        std::allocator<char>::allocator();
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                  (local_7c8,paVar15);
        std::allocator<char>::~allocator(local_7ca);
        jsonpatch_names<char>::op_name_abi_cxx11_();
        local_7e0 = std::__cxx11::string::operator_cast_to_basic_string_view(local_800);
        jsonpatch_names<char>::replace_name_abi_cxx11_();
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<std::__cxx11::string>
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff5f0._M_current);
        std::__cxx11::string::~string(local_820);
        std::__cxx11::string::~string(local_800);
        jsonpatch_names<char>::path_name_abi_cxx11_();
        local_848 = std::__cxx11::string::operator_cast_to_basic_string_view(local_868);
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   in_stack_fffffffffffff5f0._M_current);
        std::__cxx11::string::~string(local_868);
        jsonpatch_names<char>::value_name_abi_cxx11_();
        local_890 = std::__cxx11::string::operator_cast_to_basic_string_view(local_8b0);
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&>
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                   in_stack_fffffffffffff5f0._M_current);
        std::__cxx11::string::~string(local_8b0);
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                  (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   0x54f820);
        uVar7 = extraout_RDX_02;
      }
    }
  }
  bVar14.field_0.int64_.val_ = uVar7;
  bVar14.field_0._0_8_ = in_RDI;
  return (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>)bVar14.field_0;
}

Assistant:

Json from_diff(const Json& source, const Json& target, const typename Json::string_view_type& path)
    {
        using char_type = typename Json::char_type;

        Json result = typename Json::array();

        if (source == target)
        {
            return result;
        }

        if (source.is_array() && target.is_array())
        {
            std::size_t common = (std::min)(source.size(),target.size());
            for (std::size_t i = 0; i < common; ++i)
            {
                std::basic_string<char_type> ss(path); 
                ss.push_back('/');
                jsoncons::detail::from_integer(i,ss);
                auto temp_diff = from_diff(source[i],target[i],ss);
                result.insert(result.array_range().end(),temp_diff.array_range().begin(),temp_diff.array_range().end());
            }
            // Element in source, not in target - remove
            for (std::size_t i = source.size(); i-- > target.size();)
            {
                std::basic_string<char_type> ss(path); 
                ss.push_back('/');
                jsoncons::detail::from_integer(i,ss);
                Json val(json_object_arg);
                val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::remove_name());
                val.insert_or_assign(jsonpatch_names<char_type>::path_name(), ss);
                result.push_back(std::move(val));
            }
            // Element in target, not in source - add, 
            // Fix contributed by Alexander rog13
            for (std::size_t i = source.size(); i < target.size(); ++i)
            {
                const auto& a = target[i];
                std::basic_string<char_type> ss(path); 
                ss.push_back('/');
                jsoncons::detail::from_integer(i,ss);
                Json val(json_object_arg);
                val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::add_name());
                val.insert_or_assign(jsonpatch_names<char_type>::path_name(), ss);
                val.insert_or_assign(jsonpatch_names<char_type>::value_name(), a);
                result.push_back(std::move(val));
            }
        }
        else if (source.is_object() && target.is_object())
        {
            for (const auto& a : source.object_range())
            {
                std::basic_string<char_type> ss(path);
                ss.push_back('/'); 
                jsonpointer::escape(a.key(),ss);
                auto it = target.find(a.key());
                if (it != target.object_range().end())
                {
                    auto temp_diff = from_diff(a.value(),(*it).value(),ss);
                    result.insert(result.array_range().end(),temp_diff.array_range().begin(),temp_diff.array_range().end());
                }
                else
                {
                    Json val(json_object_arg);
                    val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::remove_name());
                    val.insert_or_assign(jsonpatch_names<char_type>::path_name(), ss);
                    result.push_back(std::move(val));
                }
            }
            for (const auto& a : target.object_range())
            {
                auto it = source.find(a.key());
                if (it == source.object_range().end())
                {
                    std::basic_string<char_type> ss(path); 
                    ss.push_back('/');
                    jsonpointer::escape(a.key(),ss);
                    Json val(json_object_arg);
                    val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::add_name());
                    val.insert_or_assign(jsonpatch_names<char_type>::path_name(), ss);
                    val.insert_or_assign(jsonpatch_names<char_type>::value_name(), a.value());
                    result.push_back(std::move(val));
                }
            }
        }
        else
        {
            Json val(json_object_arg);
            val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::replace_name());
            val.insert_or_assign(jsonpatch_names<char_type>::path_name(), path);
            val.insert_or_assign(jsonpatch_names<char_type>::value_name(), target);
            result.push_back(std::move(val));
        }

        return result;
    }